

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reoProfile.c
# Opt level: O3

void reoProfileWidthStart(reo_man *p)

{
  undefined2 uVar1;
  undefined2 uVar2;
  int iVar3;
  reo_unit **pprVar4;
  reo_unit *prVar5;
  bool bVar6;
  int *__ptr;
  int *__ptr_00;
  reo_plane *prVar7;
  ulong uVar8;
  long lVar9;
  reo_unit *prVar10;
  short *psVar11;
  long lVar12;
  int iVar13;
  size_t __size;
  
  iVar13 = p->nSupp;
  __size = (long)(int)(iVar13 + 1U) << 2;
  __ptr = (int *)calloc(1,__size);
  __ptr_00 = (int *)calloc(1,__size);
  if (-1 < (long)iVar13) {
    prVar7 = p->pPlanes;
    uVar8 = 0;
    do {
      for (prVar10 = prVar7[uVar8].pHead; prVar10 != (reo_unit *)0x0; prVar10 = prVar10->Next) {
        prVar10->TopRef = 30000;
        prVar10->Sign = 0;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != iVar13 + 1U);
  }
  iVar3 = p->nTops;
  if (0 < (long)iVar3) {
    pprVar4 = p->pTops;
    lVar9 = 0;
    do {
      psVar11 = (short *)((ulong)pprVar4[lVar9] & 0xfffffffffffffffe);
      if (psVar11[1] == 30000) {
        psVar11[1] = 0;
        *__ptr = *__ptr + 1;
        if ((long)*psVar11 != 30000) {
          __ptr_00[(long)*psVar11 + 1] = __ptr_00[(long)*psVar11 + 1] + 1;
        }
      }
      lVar9 = lVar9 + 1;
    } while (iVar3 != lVar9);
  }
  if (0 < iVar13) {
    prVar7 = p->pPlanes;
    lVar9 = 0;
    do {
      for (prVar10 = prVar7[lVar9].pHead; prVar10 != (reo_unit *)0x0; prVar10 = prVar10->Next) {
        prVar5 = prVar10->pE;
        if (prVar5->TopRef == 30000) {
          uVar1 = prVar10->lev;
          prVar5->TopRef = uVar1 + 1;
          __ptr[(short)(uVar1 + 1)] = __ptr[(short)(uVar1 + 1)] + 1;
          if ((long)prVar5->lev != 30000) {
            __ptr_00[(long)prVar5->lev + 1] = __ptr_00[(long)prVar5->lev + 1] + 1;
          }
        }
        prVar5 = prVar10->pT;
        if (prVar5->TopRef == 30000) {
          uVar2 = prVar10->lev;
          prVar5->TopRef = uVar2 + 1;
          __ptr[(short)(uVar2 + 1)] = __ptr[(short)(uVar2 + 1)] + 1;
          if ((long)prVar5->lev != 30000) {
            __ptr_00[(long)prVar5->lev + 1] = __ptr_00[(long)prVar5->lev + 1] + 1;
          }
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != iVar13);
    if (0 < iVar13) {
      lVar9 = 0;
      lVar12 = 0;
      do {
        reoProfileWidthVerifyLevel((reo_plane *)((long)&p->pPlanes->fSifted + lVar9),(int)lVar12);
        lVar12 = lVar12 + 1;
        iVar13 = p->nSupp;
        lVar9 = lVar9 + 0x38;
      } while (lVar12 < iVar13);
    }
  }
  p->nWidthCur = 0;
  if (iVar13 < 0) {
    p->nWidthBeg = 0;
    if (__ptr == (int *)0x0) goto LAB_0081d523;
  }
  else {
    lVar9 = 0;
    uVar8 = 0;
    do {
      if (uVar8 == 0) {
        prVar7 = p->pPlanes;
        prVar7->statsWidth = *__ptr - *__ptr_00;
      }
      else {
        prVar7 = p->pPlanes;
        *(int *)((long)&prVar7->statsWidth + lVar9) =
             (__ptr[uVar8] + *(int *)((long)prVar7 + lVar9 + -0x30)) - __ptr_00[uVar8];
      }
      iVar13 = *(int *)((long)&prVar7->statsWidth + lVar9);
      *(double *)((long)&prVar7->statsCost + lVar9) = (double)iVar13;
      p->nWidthCur = p->nWidthCur + iVar13;
      printf("Level %2d: Width = %5d.\n",uVar8 & 0xffffffff);
      lVar9 = lVar9 + 0x38;
      bVar6 = (long)uVar8 < (long)p->nSupp;
      uVar8 = uVar8 + 1;
    } while (bVar6);
    p->nWidthBeg = p->nWidthCur;
  }
  free(__ptr);
LAB_0081d523:
  if (__ptr_00 != (int *)0x0) {
    free(__ptr_00);
    return;
  }
  return;
}

Assistant:

void reoProfileWidthStart( reo_man * p )
{
    reo_unit * pUnit;
    int * pWidthStart;
    int * pWidthStop;
    int v;

    // allocate and clean the storage for starting and stopping levels
    pWidthStart = ABC_ALLOC( int, p->nSupp + 1 );
    pWidthStop  = ABC_ALLOC( int, p->nSupp + 1 );
    memset( pWidthStart, 0, sizeof(int) * (p->nSupp + 1) );
    memset( pWidthStop, 0, sizeof(int) * (p->nSupp + 1) );

    // go through the non-constant nodes and set the topmost level of their cofactors
    for ( v = 0; v <= p->nSupp; v++ )
    for ( pUnit = p->pPlanes[v].pHead; pUnit; pUnit = pUnit->Next )
    {
        pUnit->TopRef = REO_TOPREF_UNDEF;
        pUnit->Sign   = 0;
    }

    // add the topmost level of the width profile
    for ( v = 0; v < p->nTops; v++ )
    {
        pUnit = Unit_Regular(p->pTops[v]);
        if ( pUnit->TopRef == REO_TOPREF_UNDEF )
        {
            // set the starting level
            pUnit->TopRef = 0;
            pWidthStart[pUnit->TopRef]++;
            // set the stopping level
            if ( pUnit->lev != REO_CONST_LEVEL )
                pWidthStop[pUnit->lev+1]++;
        }
    }

    for ( v = 0; v < p->nSupp; v++ )
    for ( pUnit = p->pPlanes[v].pHead; pUnit; pUnit = pUnit->Next )
    {
        if ( pUnit->pE->TopRef == REO_TOPREF_UNDEF )
        {
            // set the starting level
            pUnit->pE->TopRef = pUnit->lev + 1;
            pWidthStart[pUnit->pE->TopRef]++;
            // set the stopping level
            if ( pUnit->pE->lev != REO_CONST_LEVEL )
                pWidthStop[pUnit->pE->lev+1]++;
        }
        if ( pUnit->pT->TopRef == REO_TOPREF_UNDEF )
        {
            // set the starting level
            pUnit->pT->TopRef = pUnit->lev + 1;
            pWidthStart[pUnit->pT->TopRef]++;
            // set the stopping level
            if ( pUnit->pT->lev != REO_CONST_LEVEL )
                pWidthStop[pUnit->pT->lev+1]++;
        }
    }

    // verify the top reference
    for ( v = 0; v < p->nSupp; v++ )
        reoProfileWidthVerifyLevel( p->pPlanes + v, v );

    // derive the profile
    p->nWidthCur = 0;
    for ( v = 0; v <= p->nSupp; v++ )
    {
        if ( v == 0 )
            p->pPlanes[v].statsWidth = pWidthStart[v] - pWidthStop[v];
        else
            p->pPlanes[v].statsWidth = p->pPlanes[v-1].statsWidth + pWidthStart[v] - pWidthStop[v];
        p->pPlanes[v].statsCost = p->pPlanes[v].statsWidth;
        p->nWidthCur += p->pPlanes[v].statsWidth;
        printf( "Level %2d: Width = %5d.\n", v, p->pPlanes[v].statsWidth );
    }
    p->nWidthBeg = p->nWidthCur;
    ABC_FREE( pWidthStart );
    ABC_FREE( pWidthStop );
}